

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<bool>::GrowNoAnnotate
          (RepeatedField<bool> *this,bool was_soo,int old_size,int new_size)

{
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 this_00;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *paVar1;
  bool *__src;
  Nonnull<const_char_*> pcVar2;
  undefined7 in_register_00000031;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  ulong v1;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  LogMessage local_40;
  
  iVar5 = 3;
  if ((int)CONCAT71(in_register_00000031,was_soo) == 0) {
    iVar5 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (iVar5 < new_size) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)new_size,(long)iVar5,"new_size > old_capacity");
  }
  if (pcVar2 != (Nonnull<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x4ad,pcVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    this_00.arena = internal::SooRep::soo_arena(&this->soo_rep_);
  }
  else {
    paVar1 = &heap_rep(this)->field_0;
    this_00 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1)paVar1->arena;
  }
  uVar4 = 8;
  if (7 < new_size) {
    if (iVar5 < 0x3ffffffc) {
      uVar3 = 8;
      if (7 < iVar5) {
        uVar3 = iVar5 * 2 + 8;
      }
      uVar4 = (ulong)uVar3;
      if ((int)uVar3 <= new_size) {
        uVar4 = (ulong)(uint)new_size;
      }
    }
    else {
      uVar4 = 0x7fffffff;
    }
  }
  v1 = (ulong)(int)(uint)uVar4;
  if ((uint)uVar4 < 0xfffffff8) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       (v1,0xfffffffffffffff7,
                        "static_cast<size_t>(new_size) <= (std::numeric_limits<size_t>::max() - kHeapRepHeaderSize) / sizeof(Element)"
                       );
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    if (this_00.arena == (Arena *)0x0) {
      if (*(code **)(in_FS_OFFSET + -0x48) == (code *)0x0) {
        paVar1 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *)operator_new(v1 + 8);
      }
      else {
        auVar6 = (**(code **)(in_FS_OFFSET + -0x48))(v1 + 8,*(undefined8 *)(in_FS_OFFSET + -0x40));
        paVar1 = auVar6._0_8_;
        v1 = auVar6._8_8_ - 8;
      }
      uVar4 = 0x7fffffff;
      if (v1 < 0x7fffffff) {
        uVar4 = v1;
      }
    }
    else {
      paVar1 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *)
               Arena::AllocateForArray(this_00.arena,v1 + 0xf & 0xfffffffffffffff8);
    }
    paVar1->arena = (Arena *)this_00;
    if (0 < old_size) {
      __src = elements(this,was_soo);
      memcpy(paVar1 + 1,__src,(ulong)(uint)old_size);
    }
    if (!was_soo) {
      InternalDeallocate<false>(this);
    }
    internal::SooRep::set_non_soo(&this->soo_rep_,was_soo,(int)uVar4,paVar1 + 1);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
             ,0x4b6,pcVar2);
  absl::lts_20250127::log_internal::LogMessage::operator<<
            (&local_40,(char (*) [48])"Requested size is too large to fit into size_t.");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

PROTOBUF_NOINLINE void RepeatedField<Element>::GrowNoAnnotate(bool was_soo,
                                                              int old_size,
                                                              int new_size) {
  const int old_capacity = Capacity(was_soo);
  ABSL_DCHECK_GT(new_size, old_capacity);
  HeapRep* new_rep;
  Arena* arena = GetArena();

  new_size = internal::CalculateReserveSize<Element, kHeapRepHeaderSize>(
      old_capacity, new_size);

  ABSL_DCHECK_LE(static_cast<size_t>(new_size),
                 (std::numeric_limits<size_t>::max() - kHeapRepHeaderSize) /
                     sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kHeapRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == nullptr) {
    ABSL_DCHECK_LE((bytes - kHeapRepHeaderSize) / sizeof(Element),
                   static_cast<size_t>(std::numeric_limits<int>::max()))
        << "Requested size is too large to fit element count into int.";
    internal::SizedPtr res = internal::AllocateAtLeast(bytes);
    size_t num_available =
        std::min((res.n - kHeapRepHeaderSize) / sizeof(Element),
                 static_cast<size_t>(std::numeric_limits<int>::max()));
    new_size = static_cast<int>(num_available);
    new_rep = static_cast<HeapRep*>(res.p);
  } else {
    new_rep =
        reinterpret_cast<HeapRep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;

  if (old_size > 0) {
    Element* pnew = static_cast<Element*>(new_rep->elements());
    Element* pold = elements(was_soo);
    // TODO: add absl::is_trivially_relocatable<Element>
    if (std::is_trivial<Element>::value) {
      memcpy(static_cast<void*>(pnew), pold, old_size * sizeof(Element));
    } else {
      for (Element* end = pnew + old_size; pnew != end; ++pnew, ++pold) {
        ::new (static_cast<void*>(pnew)) Element(std::move(*pold));
        pold->~Element();
      }
    }
  }
  if (!was_soo) InternalDeallocate();

  soo_rep_.set_non_soo(was_soo, new_size, new_rep->elements());
}